

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O1

void rr::anon_unknown_19::writeFragmentPackets
               (RenderState *state,RenderTarget *renderTarget,Program *program,
               FragmentPacket *fragmentPackets,int numRasterizedPackets,FaceType facetype,
               vector<rr::GenericVec4,_std::allocator<rr::GenericVec4>_> *fragmentOutputArray,
               float *depthValues,
               vector<rr::Fragment,_std::allocator<rr::Fragment>_> *fragmentBuffer)

{
  pointer pFVar1;
  pointer pFVar2;
  pointer pFVar3;
  pointer pGVar4;
  int i;
  long lVar5;
  float *pfVar6;
  ulong uVar7;
  FragmentOperationState *pFVar8;
  byte bVar9;
  byte bVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  deUint64 fragMask_1;
  long lVar14;
  FragmentPacket *pFVar15;
  int *piVar16;
  long lVar17;
  int fragNdx;
  uint uVar18;
  int iVar19;
  byte bVar20;
  long local_2240;
  uint local_21f8 [2];
  long local_21f0;
  MultisamplePixelBufferAccess *local_21e8;
  MultisamplePixelBufferAccess *local_21e0;
  FragmentOperationState *local_21d8;
  Vector<int,_2> res;
  undefined8 uStack_21ac;
  undefined4 auStack_21a4 [11];
  bool local_2178;
  float local_2158 [2];
  float afStack_2150 [6];
  BVec4 local_2138;
  int local_2134;
  FragmentProcessor fragProcessor;
  
  bVar20 = 0;
  iVar19 = *(int *)&renderTarget->field_0x8;
  pFVar1 = (program->fragmentShader->m_outputs).
           super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pFVar2 = (program->fragmentShader->m_outputs).
           super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  FragmentProcessor::FragmentProcessor(&fragProcessor);
  bVar9 = (byte)iVar19;
  if (0 < numRasterizedPackets) {
    uVar7 = 0;
    iVar11 = 0;
    pFVar15 = fragmentPackets;
    do {
      uVar18 = 0;
      do {
        uVar13 = uVar18 & 1;
        bVar10 = ((char)(uVar18 >> 1) + (char)uVar13 * '\x02') * bVar9;
        uVar12 = ~(-1L << (bVar9 & 0x3f)) << (bVar10 & 0x3f);
        if ((fragmentPackets[uVar7].coverage & uVar12) != 0) {
          pFVar3 = (fragmentBuffer->super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>)
                   ._M_impl.super__Vector_impl_data._M_start;
          local_21f8[0] = uVar13;
          local_21f8[1] = uVar18 >> 1;
          res.m_data[0] = 0;
          res.m_data[1] = 0;
          lVar5 = 0;
          do {
            res.m_data[lVar5] = local_21f8[lVar5] + (pFVar15->position).m_data[lVar5];
            lVar5 = lVar5 + 1;
          } while (lVar5 == 1);
          *&pFVar3[iVar11].pixelCoord.m_data = res.m_data;
          pFVar3[iVar11].coverage =
               (deUint32)((uVar12 & fragmentPackets[uVar7].coverage) >> (bVar10 & 0x3f));
          if (depthValues == (float *)0x0) {
            pfVar6 = (float *)0x0;
          }
          else {
            pfVar6 = depthValues + (int)((uVar18 & 2 | (int)uVar7 * 4 | uVar13) * iVar19);
          }
          pFVar3[iVar11].sampleDepths = pfVar6;
          iVar11 = iVar11 + 1;
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 != 4);
      uVar7 = uVar7 + 1;
      pFVar15 = pFVar15 + 1;
    } while (uVar7 != (uint)numRasterizedPackets);
  }
  local_21d8 = &state->fragOps;
  lVar5 = 0x1e;
  pFVar8 = local_21d8;
  piVar16 = res.m_data;
  for (; lVar5 != 0; lVar5 = lVar5 + -1) {
    *piVar16 = *(int *)pFVar8;
    pFVar8 = (FragmentOperationState *)((long)pFVar8 + (ulong)bVar20 * -8 + 4);
    piVar16 = piVar16 + (ulong)bVar20 * 0xfffffffffffffffe + 1;
  }
  local_2158 = *(float (*) [2])(state->fragOps).blendColor.m_data;
  afStack_2150._0_8_ = *(undefined8 *)((state->fragOps).blendColor.m_data + 2);
  afStack_2150[2] = (state->fragOps).blendEquationAdvaced;
  afStack_2150[3]._0_1_ = (state->fragOps).sRGBEnabled;
  afStack_2150[3]._1_1_ = (state->fragOps).depthClampEnabled;
  afStack_2150[3]._2_1_ = (state->fragOps).polygonOffsetEnabled;
  afStack_2150[3]._3_1_ = (state->fragOps).field_0x8f;
  afStack_2150[4] = (state->fragOps).polygonOffsetFactor;
  afStack_2150[5] = (state->fragOps).polygonOffsetUnits;
  local_2138.m_data = *&(state->fragOps).colorMask.m_data;
  local_2134 = (state->fragOps).numStencilBits;
  local_2178 = false;
  *(undefined8 *)((long)&uStack_21ac + (ulong)facetype * 0x1c) = 0;
  auStack_21a4[(ulong)facetype * 7] = 0;
  if (pFVar2 != pFVar1) {
    lVar14 = (long)pFVar2 - (long)pFVar1 >> 2;
    local_21e0 = &renderTarget->m_depthBuffer;
    local_21e8 = &renderTarget->m_stencilBuffer;
    local_21f0 = lVar14 + (ulong)(lVar14 == 0);
    iVar19 = 0;
    local_2240 = 8;
    lVar5 = 0;
    do {
      pFVar8 = (FragmentOperationState *)&res;
      if (lVar5 == lVar14 + -1) {
        pFVar8 = local_21d8;
      }
      if (0 < numRasterizedPackets) {
        iVar11 = 0;
        uVar7 = 0;
        do {
          lVar17 = (long)iVar11 * lVar14 * 0x10 + local_2240;
          bVar20 = 0;
          uVar12 = 0;
          do {
            if ((fragmentPackets[uVar7].coverage &
                ~(-1L << (bVar9 & 0x3f)) << (((bVar20 & 2) + (char)(uVar12 >> 1)) * bVar9 & 0x3f))
                != 0) {
              pFVar3 = (fragmentBuffer->
                       super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              pGVar4 = (fragmentOutputArray->
                       super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              pFVar3[iVar19].value.v.uData[0] = *(deUint32 *)((long)pGVar4 + lVar17 + -8);
              pFVar3[iVar19].value.v.uData[1] = *(deUint32 *)((long)pGVar4 + lVar17 + -4);
              pFVar3[iVar19].value.v.uData[2] = *(deUint32 *)((long)&pGVar4->v + lVar17);
              pFVar3[iVar19].value.v.uData[3] = *(deUint32 *)((long)&pGVar4->v + lVar17 + 4);
              iVar19 = iVar19 + 1;
            }
            uVar12 = uVar12 + 1;
            bVar20 = bVar20 + 2;
            lVar17 = lVar17 + lVar14 * 0x10;
          } while (uVar12 != 4);
          uVar7 = uVar7 + 1;
          iVar11 = iVar11 + 4;
        } while (uVar7 != (uint)numRasterizedPackets);
      }
      FragmentProcessor::render
                (&fragProcessor,
                 (MultisamplePixelBufferAccess *)
                 (&renderTarget->field_0x0 + (long)(int)lVar5 * 0x28),local_21e0,local_21e8,
                 (fragmentBuffer->super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>).
                 _M_impl.super__Vector_impl_data._M_start,iVar19,facetype,pFVar8);
      lVar5 = lVar5 + 1;
      local_2240 = local_2240 + 0x10;
    } while (lVar5 != local_21f0);
  }
  return;
}

Assistant:

void writeFragmentPackets (const RenderState&					state,
						   const RenderTarget&					renderTarget,
						   const Program&						program,
						   const FragmentPacket*				fragmentPackets,
						   int									numRasterizedPackets,
						   rr::FaceType							facetype,
						   const std::vector<rr::GenericVec4>&	fragmentOutputArray,
						   const float*							depthValues,
						   std::vector<Fragment>&				fragmentBuffer)
{
	const int			numSamples		= renderTarget.getNumSamples();
	const size_t		numOutputs		= program.fragmentShader->getOutputs().size();
	FragmentProcessor	fragProcessor;

	DE_ASSERT(fragmentOutputArray.size() >= (size_t)numRasterizedPackets*4*numOutputs);
	DE_ASSERT(fragmentBuffer.size()      >= (size_t)numRasterizedPackets*4);

	// Translate fragments but do not set the value yet
	{
		int	fragCount = 0;
		for (int packetNdx = 0; packetNdx < numRasterizedPackets; ++packetNdx)
		for (int fragNdx = 0; fragNdx < 4; fragNdx++)
		{
			const FragmentPacket&	packet	= fragmentPackets[packetNdx];
			const int				xo		= fragNdx%2;
			const int				yo		= fragNdx/2;

			if (getCoverageAnyFragmentSampleLive(packet.coverage, numSamples, xo, yo))
			{
				Fragment& fragment		= fragmentBuffer[fragCount++];

				fragment.pixelCoord		= packet.position + tcu::IVec2(xo, yo);
				fragment.coverage		= (deUint32)((packet.coverage & getCoverageFragmentSampleBits(numSamples, xo, yo)) >> getCoverageOffset(numSamples, xo, yo));
				fragment.sampleDepths	= (depthValues) ? (&depthValues[(packetNdx*4 + yo*2 + xo)*numSamples]) : (DE_NULL);
			}
		}
	}

	// Set per output output values
	{
		rr::FragmentOperationState noStencilDepthWriteState(state.fragOps);
		noStencilDepthWriteState.depthMask						= false;
		noStencilDepthWriteState.stencilStates[facetype].sFail	= STENCILOP_KEEP;
		noStencilDepthWriteState.stencilStates[facetype].dpFail	= STENCILOP_KEEP;
		noStencilDepthWriteState.stencilStates[facetype].dpPass	= STENCILOP_KEEP;

		int	fragCount = 0;
		for (size_t outputNdx = 0; outputNdx < numOutputs; ++outputNdx)
		{
			// Only the last output-pass has default state, other passes have stencil & depth writemask=0
			const rr::FragmentOperationState& fragOpsState = (outputNdx == numOutputs-1) ? (state.fragOps) : (noStencilDepthWriteState);

			for (int packetNdx = 0; packetNdx < numRasterizedPackets; ++packetNdx)
			for (int fragNdx = 0; fragNdx < 4; fragNdx++)
			{
				const FragmentPacket&	packet	= fragmentPackets[packetNdx];
				const int				xo		= fragNdx%2;
				const int				yo		= fragNdx/2;

				// Add only fragments that have live samples to shaded fragments queue.
				if (getCoverageAnyFragmentSampleLive(packet.coverage, numSamples, xo, yo))
				{
					Fragment& fragment		= fragmentBuffer[fragCount++];
					fragment.value			= fragmentOutputArray[(packetNdx*4 + fragNdx) * numOutputs + outputNdx];
				}
			}

			// Execute per-fragment ops and write
			fragProcessor.render(renderTarget.getColorBuffer((int)outputNdx), renderTarget.getDepthBuffer(), renderTarget.getStencilBuffer(), &fragmentBuffer[0], fragCount, facetype, fragOpsState);
		}
	}
}